

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

bool __thiscall
graphics101::HalfEdgeTriMesh::vertex_is_boundary(HalfEdgeTriMesh *this,Index vertex_index)

{
  HalfEdge *pHVar1;
  HalfEdgeIndex local_20;
  Index local_18;
  Index vertex_index_local;
  HalfEdgeTriMesh *this_local;
  
  local_18 = vertex_index;
  vertex_index_local = (Index)this;
  local_20 = outgoing_halfedge_index_for_vertex(this,vertex_index);
  pHVar1 = halfedge(this,&local_20);
  return pHVar1->face == -1;
}

Assistant:

bool HalfEdgeTriMesh::vertex_is_boundary( const Index vertex_index ) const
{
    return -1 == halfedge( outgoing_halfedge_index_for_vertex( vertex_index ) ).face;
}